

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O2

void __thiscall OPNMIDIplay::markSostenutoNotes(OPNMIDIplay *this,int32_t midCh)

{
  uint uVar1;
  pointer pOVar2;
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar3;
  ulong uVar4;
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar5;
  users_iterator j;
  
  pOVar2 = (this->m_chipChannels).
           super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = ((this->m_synth).m_p)->m_numChannels;
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    if (pOVar2[uVar4].users.size_ != 0) {
      ppVar3 = pOVar2[uVar4].users.first_;
      while (ppVar5 = ppVar3,
            ppVar3 = (ppVar5->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next,
            ppVar3 != (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) {
        if (((uint)(ppVar5->value).loc.MidCh == midCh) && ((ppVar5->value).sustained == 0)) {
          (ppVar5->value).sustained = 2;
        }
      }
    }
  }
  return;
}

Assistant:

void OPNMIDIplay::markSostenutoNotes(int32_t midCh)
{
    Synth &synth = *m_synth;
    uint32_t first = 0, last = synth.m_numChannels;
    for(uint32_t c = first; c < last; ++c)
    {
        if(m_chipChannels[c].users.empty())
            continue; // Nothing to do

        for(OpnChannel::users_iterator jnext = m_chipChannels[c].users.begin(); !jnext.is_end();)
        {
            OpnChannel::users_iterator j = jnext;
            OpnChannel::LocationData &jd = j->value;
            ++jnext;
            if((jd.loc.MidCh == midCh) && (jd.sustained == OpnChannel::LocationData::Sustain_None))
                jd.sustained |= OpnChannel::LocationData::Sustain_Sostenuto;
        }
    }
}